

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O1

void t5(int pi)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  gpioPulse_t wf [4];
  char text [2048];
  
  wf[2].usDelay = 60000;
  wf[3].gpioOn = 0;
  wf[3].gpioOff = 0x2000000;
  wf[3].usDelay = 100000;
  wf[1].gpioOff = 0x2000000;
  wf[1].usDelay = 30000;
  wf[2].gpioOn = 0x2000000;
  wf[2].gpioOff = 0;
  wf[0].gpioOn = 0x2000000;
  wf[0].gpioOff = 0;
  wf[0].usDelay = 10000;
  wf[1].gpioOn = 0;
  puts("Waveforms & serial read/write tests.");
  uVar1 = callback(pi,0x19,1);
  set_mode(pi,0x19,1);
  iVar2 = wave_clear(pi);
  CHECK(5,1,iVar2,0,0,"callback, set mode, wave clear");
  iVar2 = wave_add_generic(pi,4,wf);
  CHECK(5,2,iVar2,4,0,"pulse, wave add generic");
  uVar3 = wave_create(pi);
  iVar2 = wave_send_repeat(pi,uVar3);
  iVar4 = 0x13;
  if (iVar2 < 0xe) {
    iVar4 = 9;
  }
  CHECK(5,3,iVar2,iVar4,0,"wave tx repeat");
  iVar2 = t5_count;
  time_sleep(0x33333333);
  CHECK(5,4,t5_count - iVar2,0x32,2,"callback");
  iVar2 = wave_tx_stop(pi);
  CHECK(5,5,iVar2,0,0,"wave tx stop");
  iVar2 = bb_serial_read_open(pi,0x19,0x12c0);
  CHECK(5,6,iVar2,0,0,"serial read open");
  wave_clear(pi);
  iVar2 = wave_add_serial(pi,0x19,0x12c0,8,2,5000000,0x22c,
                          "\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
                         );
  CHECK(5,7,iVar2,0xd4d,0,"wave clear, wave add serial");
  uVar3 = wave_create(pi);
  iVar2 = wave_send_once(pi,uVar3);
  iVar4 = 0x1bcc;
  if (iVar2 < 0x1b34) {
    iVar4 = 0x1a9b;
  }
  CHECK(5,8,iVar2,iVar4,0,"wave tx start");
  iVar2 = t5_count;
  time_sleep(0);
  CHECK(5,9,t5_count - iVar2,0,0,"callback");
  iVar2 = t5_count;
  while( true ) {
    iVar4 = wave_tx_busy(pi);
    if (iVar4 == 0) break;
    time_sleep(0x9999999a);
  }
  time_sleep(0x9999999a);
  CHECK(5,10,t5_count - iVar2,0x6a6,0,"wave tx busy, callback");
  uVar5 = bb_serial_read(pi,0x19,text);
  if (0 < (int)uVar5) {
    text[uVar5] = '\0';
  }
  iVar2 = strcmp("\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
                 ,text);
  CHECK(5,0xb,iVar2,0,0,"wave tx busy, serial read");
  iVar2 = bb_serial_read_close(pi,0x19);
  CHECK(5,0xc,iVar2,0,0,"serial read close");
  iVar2 = wave_get_micros(pi);
  CHECK(5,0xd,iVar2,0x5df744,0,"wave get micros");
  iVar2 = wave_get_high_micros(pi);
  if (0x5df743 < iVar2) {
    iVar2 = 0x5df744;
  }
  CHECK(5,0xe,iVar2,0x5df744,0,"wave get high micros");
  iVar2 = wave_get_max_micros(pi);
  CHECK(5,0xf,iVar2,1800000000,0,"wave get max micros");
  iVar2 = wave_get_pulses(pi);
  CHECK(5,0x10,iVar2,0xd4d,0,"wave get pulses");
  iVar2 = wave_get_high_pulses(pi);
  CHECK(5,0x11,iVar2,0xd4d,0,"wave get high pulses");
  iVar2 = wave_get_max_pulses(pi);
  CHECK(5,0x12,iVar2,12000,0,"wave get max pulses");
  iVar2 = wave_get_cbs(pi);
  iVar4 = 0x1bcb;
  if (iVar2 < 0x1b33) {
    iVar4 = 0x1a9a;
  }
  CHECK(5,0x13,iVar2,iVar4,0,"wave get cbs");
  iVar4 = wave_get_high_cbs(pi);
  iVar2 = 0x1bcb;
  if (iVar4 < 0x1b33) {
    iVar2 = 0x1a9a;
  }
  CHECK(5,0x14,iVar4,iVar2,0,"wave get high cbs");
  iVar2 = wave_get_max_cbs(pi);
  CHECK(5,0x15,iVar2,0x61b8,0,"wave get max cbs");
  callback_cancel(uVar1);
  return;
}

Assistant:

void t5(int pi)
{
   int BAUD=4800;

   char *TEXT=
"\n\
Now is the winter of our discontent\n\
Made glorious summer by this sun of York;\n\
And all the clouds that lour'd upon our house\n\
In the deep bosom of the ocean buried.\n\
Now are our brows bound with victorious wreaths;\n\
Our bruised arms hung up for monuments;\n\
Our stern alarums changed to merry meetings,\n\
Our dreadful marches to delightful measures.\n\
Grim-visaged war hath smooth'd his wrinkled front;\n\
And now, instead of mounting barded steeds\n\
To fright the souls of fearful adversaries,\n\
He capers nimbly in a lady's chamber\n\
To the lascivious pleasing of a lute.\n\
";

   gpioPulse_t wf[] =
   {
      {1<<GPIO, 0,  10000},
      {0, 1<<GPIO,  30000},
      {1<<GPIO, 0,  60000},
      {0, 1<<GPIO, 100000},
   };

   int e, oc, c, wid, id;

   char text[2048];

   printf("Waveforms & serial read/write tests.\n");

   id = callback(pi, GPIO, FALLING_EDGE, t5cbf);

   set_mode(pi, GPIO, PI_OUTPUT);

   e = wave_clear(pi);
   CHECK(5, 1, e, 0, 0, "callback, set mode, wave clear");

   e = wave_add_generic(pi, 4, wf);
   CHECK(5, 2, e, 4, 0, "pulse, wave add generic");

   wid = wave_create(pi);
   e = wave_send_repeat(pi, wid);
   if (e < 14) CHECK(5, 3, e,  9, 0, "wave tx repeat");
   else        CHECK(5, 3, e, 19, 0, "wave tx repeat");

   oc = t5_count;
   time_sleep(5.05);
   c = t5_count - oc;
   CHECK(5, 4, c, 50, 2, "callback");

   e = wave_tx_stop(pi);
   CHECK(5, 5, e, 0, 0, "wave tx stop");

   e = bb_serial_read_open(pi, GPIO, BAUD, 8);
   CHECK(5, 6, e, 0, 0, "serial read open");

   wave_clear(pi);
   e = wave_add_serial(pi, GPIO, BAUD, 8, 2, 5000000, strlen(TEXT), TEXT);
   CHECK(5, 7, e, 3405, 0, "wave clear, wave add serial");

   wid = wave_create(pi);
   e = wave_send_once(pi, wid);
   if (e < 6964) CHECK(5, 8, e, 6811, 0, "wave tx start");
   else          CHECK(5, 8, e, 7116, 0, "wave tx start");

   oc = t5_count;
   time_sleep(3);
   c = t5_count - oc;
   CHECK(5, 9, c, 0, 0, "callback");

   oc = t5_count;
   while (wave_tx_busy(pi)) time_sleep(0.1);
   time_sleep(0.1);
   c = t5_count - oc;
   CHECK(5, 10, c, 1702, 0, "wave tx busy, callback");

   c = bb_serial_read(pi, GPIO, text, sizeof(text)-1);
   if (c > 0) text[c] = 0; /* null terminate string */
   CHECK(5, 11, strcmp(TEXT, text), 0, 0, "wave tx busy, serial read");

   e = bb_serial_read_close(pi, GPIO);
   CHECK(5, 12, e, 0, 0, "serial read close");

   c = wave_get_micros(pi);
   CHECK(5, 13, c, 6158148, 0, "wave get micros");

   c = wave_get_high_micros(pi);
   if (c > 6158148) c = 6158148;
   CHECK(5, 14, c, 6158148, 0, "wave get high micros");

   c = wave_get_max_micros(pi);
   CHECK(5, 15, c, 1800000000, 0, "wave get max micros");

   c = wave_get_pulses(pi);
   CHECK(5, 16, c, 3405, 0, "wave get pulses");

   c = wave_get_high_pulses(pi);
   CHECK(5, 17, c, 3405, 0, "wave get high pulses");

   c = wave_get_max_pulses(pi);
   CHECK(5, 18, c, 12000, 0, "wave get max pulses");

   c = wave_get_cbs(pi);
   if (c < 6963) CHECK(5, 19, c, 6810, 0, "wave get cbs");
   else          CHECK(5, 19, c, 7115, 0, "wave get cbs");

   c = wave_get_high_cbs(pi);
   if (c < 6963) CHECK(5, 20, c, 6810, 0, "wave get high cbs");
   else          CHECK(5, 20, c, 7115, 0, "wave get high cbs");

   c = wave_get_max_cbs(pi);
   CHECK(5, 21, c, 25016, 0, "wave get max cbs");

   callback_cancel(id);
}